

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLOutput.cpp
# Opt level: O1

void __thiscall
Test::HTMLOutput::generateTestsTable
          (HTMLOutput *this,ostream *stream,SuiteInfo *suite,bool includePassed)

{
  pointer pAVar1;
  pointer pAVar2;
  pointer pAVar3;
  char cVar4;
  ostream *poVar5;
  ulong uVar6;
  long lVar7;
  pointer pAVar8;
  pointer methodName;
  ulong uVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  char *local_98;
  long local_90;
  undefined8 local_88;
  undefined2 local_80;
  undefined1 local_7e;
  string local_78;
  SuiteInfo *local_58;
  string local_50;
  
  std::__ostream_insert<char,std::char_traits<char>>(stream,"<table id=\'suite_",0x11);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,(suite->suiteName)._M_dataplus._M_p,(suite->suiteName)._M_string_length
                     );
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\'>",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,
             "<tr><th>Test-method</th><th># Assertions</th><th>Passed Assertions</th><th>Failures</th></tr>"
             ,0x5d);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  methodName = (suite->methods).
               super__Vector_base<Test::CollectorOutput::TestMethodInfo,_std::allocator<Test::CollectorOutput::TestMethodInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
  cVar4 = (char)stream;
  local_58 = suite;
  if (methodName !=
      (suite->methods).
      super__Vector_base<Test::CollectorOutput::TestMethodInfo,_std::allocator<Test::CollectorOutput::TestMethodInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      pAVar8 = (methodName->failedAssertions).
               super__Vector_base<Test::Assertion,_std::allocator<Test::Assertion>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pAVar1 = (methodName->passedAssertions).
               super__Vector_base<Test::Assertion,_std::allocator<Test::Assertion>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pAVar2 = (methodName->passedAssertions).
               super__Vector_base<Test::Assertion,_std::allocator<Test::Assertion>_>._M_impl.
               super__Vector_impl_data._M_start;
      pAVar3 = (methodName->failedAssertions).
               super__Vector_base<Test::Assertion,_std::allocator<Test::Assertion>_>._M_impl.
               super__Vector_impl_data._M_start;
      std::__ostream_insert<char,std::char_traits<char>>(stream,"<tr><td>",8);
      Output::stripMethodName(&local_78,(Output *)this,&methodName->methodName);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (stream,local_78._M_dataplus._M_p,local_78._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(",1);
      Output::truncateString(&local_50,(Output *)this,&methodName->argString,0x14);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_50._M_dataplus._M_p,local_50._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,")</td>",6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"<td>",4);
      uVar9 = ((long)pAVar8 - (long)pAVar3 >> 3) * -0x70a3d70a3d70a3d7 +
              ((long)pAVar1 - (long)pAVar2 >> 3) * -0x70a3d70a3d70a3d7;
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"</td>",5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"<td class=\'",0xb);
      uVar6 = ((long)(methodName->passedAssertions).
                     super__Vector_base<Test::Assertion,_std::allocator<Test::Assertion>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(methodName->passedAssertions).
                     super__Vector_base<Test::Assertion,_std::allocator<Test::Assertion>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3) * -0x70a3d70a3d70a3d7;
      if (uVar9 == uVar6) {
        local_88 = 0x65737361506c6c61;
LAB_0011cdcc:
        local_90 = 9;
        local_80 = 100;
      }
      else {
        if (uVar6 < uVar9 * 3 >> 2) {
          if (uVar6 < (uVar9 >> 1 & 0x3fffffffffffffff)) {
            if (uVar6 < uVar9 >> 2) {
              local_88 = 0x6573736150776566;
              goto LAB_0011cdcc;
            }
            local_88 = 0x73736150656d6f73;
          }
          else {
            local_88 = 0x73736150796e616d;
          }
        }
        else {
          local_88 = 0x7373615074736f6d;
        }
        local_80 = 0x6465;
        local_90 = 10;
        local_7e = 0;
      }
      local_98 = (char *)&local_88;
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_98,local_90);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\'>",2);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," (",2);
      lVar7 = ((long)(methodName->passedAssertions).
                     super__Vector_base<Test::Assertion,_std::allocator<Test::Assertion>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(methodName->passedAssertions).
                     super__Vector_base<Test::Assertion,_std::allocator<Test::Assertion>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3) * -0x70a3d70a3d70a3d7;
      auVar11._8_4_ = (int)((ulong)lVar7 >> 0x20);
      auVar11._0_8_ = lVar7;
      auVar11._12_4_ = 0x45300000;
      auVar12._8_4_ = (int)(uVar9 >> 0x20);
      auVar12._0_8_ = uVar9;
      auVar12._12_4_ = 0x45300000;
      dVar10 = Output::prettifyPercentage
                         ((Output *)this,
                          (auVar11._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0),
                          (auVar12._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)uVar9) - 4503599627370496.0));
      poVar5 = std::ostream::_M_insert<double>(dVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"%)</td>",7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"<td>",4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      for (pAVar8 = (methodName->failedAssertions).
                    super__Vector_base<Test::Assertion,_std::allocator<Test::Assertion>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pAVar8 != (methodName->failedAssertions).
                    super__Vector_base<Test::Assertion,_std::allocator<Test::Assertion>_>._M_impl.
                    super__Vector_impl_data._M_finish; pAVar8 = pAVar8 + 1) {
        std::__ostream_insert<char,std::char_traits<char>>
                  (stream,"<span class=\'message\'><a href=\'file://",0x26);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (stream,(pAVar8->file)._M_dataplus._M_p,(pAVar8->file)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\'>",2);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,(pAVar8->file)._M_dataplus._M_p,(pAVar8->file)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"</a>: ",6);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
        Output::truncateString
                  (&local_78,(Output *)this,
                   &pAVar8->errorMessage + ((pAVar8->errorMessage)._M_string_length == 0),0x3e);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_78._M_dataplus._M_p,local_78._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"</span>",7);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p);
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>(stream,"</td>",5);
      std::__ostream_insert<char,std::char_traits<char>>(stream,"</tr>",5);
      std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar4);
      std::ostream::put(cVar4);
      std::ostream::flush();
      methodName = methodName + 1;
    } while (methodName !=
             (local_58->methods).
             super__Vector_base<Test::CollectorOutput::TestMethodInfo,_std::allocator<Test::CollectorOutput::TestMethodInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,"</table>",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar4);
  std::ostream::put(cVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(stream,"<a href=\'#top\'>Back to top</a>",0x1e)
  ;
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar4);
  std::ostream::put(cVar4);
  std::ostream::flush();
  return;
}

Assistant:

void HTMLOutput::generateTestsTable(std::ostream &stream, const SuiteInfo &suite, bool includePassed) {
  stream << "<table id='suite_" << suite.suiteName << "'>"
         << "<tr><th>Test-method</th><th># Assertions</th><th>Passed Assertions</th><th>Failures</th></tr>"
         << std::endl;
  // content
  auto testMethod = suite.methods.begin();
  while (testMethod != suite.methods.end()) {
    std::size_t totalAssertions = testMethod->passedAssertions.size() + testMethod->failedAssertions.size();
    stream << "<tr><td>" << stripMethodName(testMethod->methodName) << "(" << truncateString(testMethod->argString, 20)
           << ")</td>"
           << "<td>" << totalAssertions << "</td>"
           << "<td class='" << getCssClass(totalAssertions, testMethod->passedAssertions.size()) << "'>"
           << testMethod->passedAssertions.size() << " ("
           << prettifyPercentage(
                  static_cast<double>(testMethod->passedAssertions.size()), static_cast<double>(totalAssertions))
           << "%)</td>"
           << "<td>";
    auto assertion = testMethod->failedAssertions.begin();
    while (assertion != testMethod->failedAssertions.end()) {
      stream << "<span class='message'><a href='file://" << assertion->file << "'>" << assertion->file
             << "</a>: " << assertion->lineNumber << ": "
             << truncateString(
                    (!assertion->errorMessage.empty() ? assertion->errorMessage : assertion->userMessage), 62)
             << "</span>";
      ++assertion;
    }
    stream << "</td>"
           << "</tr>" << std::endl;
    ++testMethod;
  }
  stream << "</table>" << std::endl;
  stream << "<a href='#top'>Back to top</a>" << std::endl;
}